

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::capsule::capsule(capsule *this,void *value,_func_void_void_ptr *destructor)

{
  _func_void_void_ptr *p_Var1;
  int iVar2;
  _func_void_PyObject_ptr *p_Var3;
  PyObject *pPVar4;
  error_already_set *this_00;
  _lambda__object___1_ local_21;
  _func_void_void_ptr *local_20;
  _func_void_void_ptr *destructor_local;
  void *value_local;
  capsule *this_local;
  
  local_20 = destructor;
  destructor_local = (_func_void_void_ptr *)value;
  value_local = this;
  object::object(&this->super_object);
  p_Var1 = destructor_local;
  p_Var3 = capsule(void_const*,void(*)(void*))::{lambda(_object*)#1}::
           operator_cast_to_function_pointer(&local_21);
  pPVar4 = (PyObject *)PyCapsule_New(p_Var1,0,p_Var3);
  (this->super_object).super_handle.m_ptr = pPVar4;
  if ((this->super_object).super_handle.m_ptr != (PyObject *)0x0) {
    iVar2 = PyCapsule_SetContext((this->super_object).super_handle.m_ptr,local_20);
    if (iVar2 == 0) {
      return;
    }
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

capsule(const void *value, void (*destructor)(void *)) {
        m_ptr = PyCapsule_New(const_cast<void *>(value), nullptr, [](PyObject *o) {
            // guard if destructor called while err indicator is set
            error_scope error_guard;
            auto destructor = reinterpret_cast<void (*)(void *)>(PyCapsule_GetContext(o));
            if (destructor == nullptr) {
                if (PyErr_Occurred()) {
                    throw error_already_set();
                }
                pybind11_fail("Unable to get capsule context");
            }
            const char *name = get_name_in_error_scope(o);
            void *ptr = PyCapsule_GetPointer(o, name);
            if (ptr == nullptr) {
                throw error_already_set();
            }
            destructor(ptr);
        });

        if (!m_ptr || PyCapsule_SetContext(m_ptr, (void *) destructor) != 0) {
            throw error_already_set();
        }
    }